

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O0

void get_builtin(gen_ctx_t gen_ctx,MIR_insn_code_t code,MIR_item_t_conflict *proto_item,
                MIR_item_t_conflict *func_import_item)

{
  MIR_item_t_conflict pMVar1;
  gen_ctx *pgVar2;
  MIR_type_t local_3c;
  MIR_context_t pMStack_38;
  MIR_type_t res_type;
  MIR_context_t ctx;
  MIR_item_t_conflict *func_import_item_local;
  MIR_item_t_conflict *proto_item_local;
  gen_ctx_t pgStack_18;
  MIR_insn_code_t code_local;
  gen_ctx_t gen_ctx_local;
  
  pMStack_38 = gen_ctx->ctx;
  *proto_item = (MIR_item_t_conflict)0x0;
  *func_import_item = (MIR_item_t_conflict)0x0;
  ctx = (MIR_context_t)func_import_item;
  func_import_item_local = proto_item;
  proto_item_local._4_4_ = code;
  pgStack_18 = gen_ctx;
  if (code == MIR_UI2F) {
    local_3c = MIR_T_F;
    pMVar1 = _MIR_builtin_proto(pMStack_38,gen_ctx->curr_func_item->module,UI2F_P,1,&local_3c,1,6,
                                "v");
    *func_import_item_local = pMVar1;
    pgVar2 = (gen_ctx *)
             _MIR_builtin_func(pMStack_38,pgStack_18->curr_func_item->module,UI2F,mir_ui2f);
    ctx->gen_ctx = pgVar2;
  }
  else if (code == MIR_UI2D) {
    local_3c = MIR_T_D;
    pMVar1 = _MIR_builtin_proto(pMStack_38,gen_ctx->curr_func_item->module,UI2D_P,1,&local_3c,1,6,
                                "v");
    *func_import_item_local = pMVar1;
    pgVar2 = (gen_ctx *)
             _MIR_builtin_func(pMStack_38,pgStack_18->curr_func_item->module,UI2D,mir_ui2d);
    ctx->gen_ctx = pgVar2;
  }
  else if (code == MIR_UI2LD) {
    local_3c = MIR_T_LD;
    pMVar1 = _MIR_builtin_proto(pMStack_38,gen_ctx->curr_func_item->module,UI2LD_P,1,&local_3c,1,6,
                                "v");
    *func_import_item_local = pMVar1;
    pgVar2 = (gen_ctx *)
             _MIR_builtin_func(pMStack_38,pgStack_18->curr_func_item->module,UI2LD,mir_ui2ld);
    ctx->gen_ctx = pgVar2;
  }
  else if (code == MIR_LD2I) {
    local_3c = MIR_T_I64;
    pMVar1 = _MIR_builtin_proto(pMStack_38,gen_ctx->curr_func_item->module,LD2I_P,1,&local_3c,1,10,
                                "v");
    *func_import_item_local = pMVar1;
    pgVar2 = (gen_ctx *)
             _MIR_builtin_func(pMStack_38,pgStack_18->curr_func_item->module,LD2I,mir_ld2i);
    ctx->gen_ctx = pgVar2;
  }
  else if (code == MIR_VA_ARG) {
    local_3c = MIR_T_I64;
    pMVar1 = _MIR_builtin_proto(pMStack_38,gen_ctx->curr_func_item->module,VA_ARG_P,1,&local_3c,2,6,
                                "va",6,"type");
    *func_import_item_local = pMVar1;
    pgVar2 = (gen_ctx *)
             _MIR_builtin_func(pMStack_38,pgStack_18->curr_func_item->module,VA_ARG,va_arg_builtin);
    ctx->gen_ctx = pgVar2;
  }
  else {
    if (code != MIR_VA_BLOCK_ARG) {
      __assert_fail("FALSE",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                    ,0x249,
                    "void get_builtin(gen_ctx_t, MIR_insn_code_t, MIR_item_t *, MIR_item_t *)");
    }
    pMVar1 = _MIR_builtin_proto(pMStack_38,gen_ctx->curr_func_item->module,VA_BLOCK_ARG_P,0,
                                (MIR_type_t *)0x0,4,6,"res",6,"va",6,"size",6,"ncase");
    *func_import_item_local = pMVar1;
    pgVar2 = (gen_ctx *)
             _MIR_builtin_func(pMStack_38,pgStack_18->curr_func_item->module,VA_BLOCK_ARG,
                               va_block_arg_builtin);
    ctx->gen_ctx = pgVar2;
  }
  return;
}

Assistant:

static void get_builtin (gen_ctx_t gen_ctx, MIR_insn_code_t code, MIR_item_t *proto_item,
                         MIR_item_t *func_import_item) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_type_t res_type;

  *func_import_item = *proto_item = NULL; /* to remove uninitialized warning */
  switch (code) {
  case MIR_UI2F:
    res_type = MIR_T_F;
    *proto_item
      = _MIR_builtin_proto (ctx, curr_func_item->module, UI2F_P, 1, &res_type, 1, MIR_T_I64, "v");
    *func_import_item = _MIR_builtin_func (ctx, curr_func_item->module, UI2F, mir_ui2f);
    break;
  case MIR_UI2D:
    res_type = MIR_T_D;
    *proto_item
      = _MIR_builtin_proto (ctx, curr_func_item->module, UI2D_P, 1, &res_type, 1, MIR_T_I64, "v");
    *func_import_item = _MIR_builtin_func (ctx, curr_func_item->module, UI2D, mir_ui2d);
    break;
  case MIR_UI2LD:
    res_type = MIR_T_LD;
    *proto_item
      = _MIR_builtin_proto (ctx, curr_func_item->module, UI2LD_P, 1, &res_type, 1, MIR_T_I64, "v");
    *func_import_item = _MIR_builtin_func (ctx, curr_func_item->module, UI2LD, mir_ui2ld);
    break;
  case MIR_LD2I:
    res_type = MIR_T_I64;
    *proto_item
      = _MIR_builtin_proto (ctx, curr_func_item->module, LD2I_P, 1, &res_type, 1, MIR_T_LD, "v");
    *func_import_item = _MIR_builtin_func (ctx, curr_func_item->module, LD2I, mir_ld2i);
    break;
  case MIR_VA_ARG:
    res_type = MIR_T_I64;
    *proto_item = _MIR_builtin_proto (ctx, curr_func_item->module, VA_ARG_P, 1, &res_type, 2,
                                      MIR_T_I64, "va", MIR_T_I64, "type");
    *func_import_item = _MIR_builtin_func (ctx, curr_func_item->module, VA_ARG, va_arg_builtin);
    break;
  case MIR_VA_BLOCK_ARG:
    *proto_item
      = _MIR_builtin_proto (ctx, curr_func_item->module, VA_BLOCK_ARG_P, 0, NULL, 4, MIR_T_I64,
                            "res", MIR_T_I64, "va", MIR_T_I64, "size", MIR_T_I64, "ncase");
    *func_import_item
      = _MIR_builtin_func (ctx, curr_func_item->module, VA_BLOCK_ARG, va_block_arg_builtin);
    break;
  default: assert (FALSE);
  }
}